

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Own<kj::AsyncOutputStream>,kj::Own<kj::AsyncInputStream>>
          (Promise<void> *this,Own<kj::AsyncOutputStream> *attachments,
          Own<kj::AsyncInputStream> *attachments_1)

{
  AsyncOutputStream *pAVar1;
  AsyncInputStream *pAVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long *in_RCX;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Own<kj::AsyncInputStream>_>_>
  *pAVar5;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Own<kj::AsyncInputStream>_>_>
  *extraout_RDX;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Own<kj::AsyncInputStream>_>_>
  *extraout_RDX_00;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Own<kj::AsyncInputStream>_>_>_>
  OVar6;
  Promise<void> PVar7;
  Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Own<kj::AsyncInputStream>_> local_38;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.disposer =
       attachments_1->disposer;
  local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.ptr =
       (AsyncOutputStream *)attachments_1->ptr;
  attachments_1->ptr = (AsyncInputStream *)0x0;
  local_38.impl.super_TupleElement<1U,_kj::Own<kj::AsyncInputStream>_>.value.disposer =
       (Disposer *)*in_RCX;
  local_38.impl.super_TupleElement<1U,_kj::Own<kj::AsyncInputStream>_>.value.ptr =
       (AsyncInputStream *)in_RCX[1];
  in_RCX[1] = 0;
  OVar6 = heap<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::Own<kj::AsyncInputStream>>>,kj::Own<kj::_::PromiseNode>,kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::Own<kj::AsyncInputStream>>>
                    ((kj *)&local_18,(Own<kj::_::PromiseNode> *)attachments,&local_38);
  pAVar2 = local_38.impl.super_TupleElement<1U,_kj::Own<kj::AsyncInputStream>_>.value.ptr;
  pAVar5 = OVar6.ptr;
  uVar3 = (undefined4)uStack_10;
  uVar4 = uStack_10._4_4_;
  uStack_10 = 0;
  *(undefined4 *)&(this->super_PromiseBase).node.disposer = local_18;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.disposer + 4) = uStack_14;
  *(undefined4 *)&(this->super_PromiseBase).node.ptr = uVar3;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.ptr + 4) = uVar4;
  if (local_38.impl.super_TupleElement<1U,_kj::Own<kj::AsyncInputStream>_>.value.ptr !=
      (AsyncInputStream *)0x0) {
    local_38.impl.super_TupleElement<1U,_kj::Own<kj::AsyncInputStream>_>.value.ptr =
         (AsyncInputStream *)0x0;
    (**(local_38.impl.super_TupleElement<1U,_kj::Own<kj::AsyncInputStream>_>.value.disposer)->
       _vptr_Disposer)(local_38.impl.super_TupleElement<1U,_kj::Own<kj::AsyncInputStream>_>.value.
                       disposer,pAVar2->_vptr_AsyncInputStream[-2] +
                                (long)&pAVar2->_vptr_AsyncInputStream);
    pAVar5 = extraout_RDX;
  }
  pAVar1 = local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.ptr;
  if ((AsyncInputStream *)
      local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.ptr !=
      (AsyncInputStream *)0x0) {
    local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.ptr =
         (AsyncOutputStream *)0x0;
    (**(local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.disposer)->
       _vptr_Disposer)(local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.
                       disposer,pAVar1->_vptr_AsyncOutputStream[-2] +
                                (long)&pAVar1->_vptr_AsyncOutputStream);
    pAVar5 = extraout_RDX_00;
  }
  PVar7.super_PromiseBase.node.ptr = (PromiseNode *)pAVar5;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}